

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ini.h
# Opt level: O2

int ini_section_add(ini_t *ini,char *name,int length)

{
  int iVar1;
  int iVar2;
  ini_internal_section_t *__dest;
  char *pcVar3;
  size_t __n;
  
  if (name != (char *)0x0 && ini != (ini_t *)0x0) {
    if (length < 1) {
      length = sx_strlen(name);
    }
    iVar2 = ini->section_count;
    iVar1 = ini->section_capacity;
    if (iVar2 < iVar1) {
      __dest = ini->sections;
    }
    else {
      ini->section_capacity = iVar1 * 2;
      __dest = (ini_internal_section_t *)
               (**ini->memctx)(0,(long)iVar1 * 0x50,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      memcpy(__dest,ini->sections,(long)ini->section_count * 0x28);
      (**ini->memctx)(ini->sections,0,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      ini->sections = __dest;
      iVar2 = ini->section_count;
    }
    __dest[iVar2].name_large = (char *)0x0;
    if (length - 0x1fU < 0xffffffe0) {
      __n = (size_t)length;
      pcVar3 = (char *)(**ini->memctx)(0,__n + 1,0,0,0,0,*(undefined8 *)((long)ini->memctx + 8));
      ini->sections[ini->section_count].name_large = pcVar3;
      memcpy(pcVar3,name,__n);
      pcVar3 = ini->sections[ini->section_count].name_large + __n;
    }
    else {
      memcpy(__dest + iVar2,name,(long)length);
      pcVar3 = ini->sections[ini->section_count].name + length;
    }
    *pcVar3 = '\0';
    iVar2 = ini->section_count;
    ini->section_count = iVar2 + 1;
    return iVar2;
  }
  return -1;
}

Assistant:

int ini_section_add( ini_t* ini, char const* name, int length )
    {
    struct ini_internal_section_t* new_sections;
    
    if( ini && name )
        {
        if( length <= 0 ) length = (int) INI_STRLEN( name );
        if( ini->section_count >= ini->section_capacity )
            {
            ini->section_capacity *= 2;
            new_sections = (struct ini_internal_section_t*) INI_MALLOC( ini->memctx, 
                ini->section_capacity * sizeof( ini->sections[ 0 ] ) );
            INI_MEMCPY( new_sections, ini->sections, ini->section_count * sizeof( ini->sections[ 0 ] ) );
            INI_FREE( ini->memctx, ini->sections );
            ini->sections = new_sections;
            }

        ini->sections[ ini->section_count ].name_large = 0;
        if( length + 1 >= sizeof( ini->sections[ 0 ].name ) )
            {
            ini->sections[ ini->section_count ].name_large = (char*) INI_MALLOC( ini->memctx, (size_t) length + 1 );
            INI_MEMCPY( ini->sections[ ini->section_count ].name_large, name, (size_t) length );
            ini->sections[ ini->section_count ].name_large[ length ] = '\0';
            }
        else
            {
            INI_MEMCPY( ini->sections[ ini->section_count ].name, name, (size_t) length );
            ini->sections[ ini->section_count ].name[ length ] = '\0';
            }

        return ini->section_count++;
        }
    return INI_NOT_FOUND;
    }